

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O3

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l)

{
  bool bVar1;
  reference pvVar2;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var3;
  
  do {
    bVar1 = LoadNextSegment(this,l);
  } while (bVar1);
  if ((this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var3._M_head_impl = (RowGroup *)0x0;
  }
  else {
    pvVar2 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::back(&this->nodes);
    _Var3._M_head_impl =
         (pvVar2->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  }
  return _Var3._M_head_impl;
}

Assistant:

T *GetLastSegment(SegmentLock &l) {
		LoadAllSegments(l);
		if (nodes.empty()) {
			return nullptr;
		}
		return nodes.back().node.get();
	}